

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D::forward
          (Convolution1D *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int _kernel_w;
  int _h;
  Mat *bottom_blob;
  int *piVar1;
  pointer top_blob;
  int iVar2;
  Option *opt_00;
  Mat local_128;
  Mat local_d8;
  Mat local_88;
  pointer local_38;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_38 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  _kernel_w = bottom_blob[1].w;
  _h = bottom_blob[1].c;
  local_88.cstep = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.elemsize._0_4_ = 0;
  local_88._20_8_ = 0;
  local_88.allocator = (Allocator *)0x0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.h = 0;
  local_88.d = 0;
  local_88.c = 0;
  flatten(bottom_blob + 1,&local_88,opt);
  iVar2 = -100;
  if ((local_88.data == (void *)0x0) || ((long)local_88.c * local_88.cstep == 0)) goto LAB_005242ac;
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8._20_8_ = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  if (this->bias_term == 0) {
LAB_005240fc:
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    make_padding(this,bottom_blob,&local_128,_kernel_w,opt);
    top_blob = local_38;
    iVar2 = -100;
    if ((local_128.data != (void *)0x0) && ((long)local_128.c * local_128.cstep != 0)) {
      opt_00 = (Option *)0x524198;
      Mat::create(local_38,(~((_kernel_w + -1) * this->dilation_w) + local_128.w) / this->stride_w +
                           1,_h,CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize),
                  opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        convolution1d(&local_128,top_blob,&local_88,&local_d8,_kernel_w,this->stride_w,
                      this->dilation_w,this->activation_type,&this->activation_params,opt_00);
        iVar2 = 0;
      }
    }
    piVar1 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
  }
  else {
    flatten((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + 2,&local_d8,opt);
    iVar2 = -100;
    if ((local_d8.data != (void *)0x0) && ((long)local_d8.c * local_d8.cstep != 0))
    goto LAB_005240fc;
  }
  piVar1 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8._20_8_ = 0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
LAB_005242ac:
  piVar1 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if (local_88.data != (void *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar2;
}

Assistant:

int Convolution1D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.c;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, _kernel_w, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;

    top_blob.create(outw, _num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution1d(bottom_blob_bordered, top_blob, weight_data_flattened, bias_data_flattened, _kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}